

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O3

TA_RetCode TA_ParamHolderAlloc(TA_FuncHandle *handle,TA_ParamHolder **allocatedParams)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  TA_ParamHolder *paramsToFree;
  void *pvVar7;
  double *pdVar8;
  void *pvVar9;
  long lVar10;
  TA_RetCode TVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  undefined8 *puVar15;
  
  if (allocatedParams == (TA_ParamHolder **)0x0 || handle == (TA_FuncHandle *)0x0) {
    return TA_BAD_PARAM;
  }
  if (*handle == 0xa201b201) {
    pvVar3 = *(void **)(handle + 2);
    if (pvVar3 == (void *)0x0) {
      return TA_INVALID_HANDLE;
    }
    paramsToFree = (TA_ParamHolder *)calloc(1,0x38);
    TVar11 = TA_ALLOC_ERR;
    if (paramsToFree != (TA_ParamHolder *)0x0) {
      *(undefined4 *)&paramsToFree[1].hiddenData = 0xa202b202;
      paramsToFree->hiddenData = paramsToFree + 1;
      uVar1 = *(uint *)((long)pvVar3 + 0x24);
      if ((ulong)uVar1 == 0) {
        return TA_INTERNAL_ERROR|TA_BAD_PARAM;
      }
      pvVar7 = calloc(1,(ulong)(uVar1 * 0x38));
      if (pvVar7 != (void *)0x0) {
        paramsToFree[2].hiddenData = pvVar7;
        uVar12 = (ulong)*(uint *)((long)pvVar3 + 0x28);
        if (uVar12 == 0) {
          pdVar8 = (double *)0x0;
        }
        else {
          pdVar8 = (double *)calloc(1,(ulong)(*(uint *)((long)pvVar3 + 0x28) << 4));
          if (pdVar8 == (double *)0x0) goto LAB_0018e1a4;
        }
        paramsToFree[3].hiddenData = pdVar8;
        uVar2 = *(uint *)((long)pvVar3 + 0x2c);
        pvVar9 = calloc(1,(ulong)(uVar2 << 4));
        if (pvVar9 != (void *)0x0) {
          paramsToFree[4].hiddenData = pvVar9;
          paramsToFree[6].hiddenData = pvVar3;
          lVar10 = *(long *)(handle + 4);
          lVar4 = *(long *)(handle + 6);
          lVar5 = *(long *)(handle + 8);
          puVar15 = (undefined8 *)((long)pvVar7 + 0x30);
          uVar13 = 0;
          iVar14 = 0;
          do {
            *puVar15 = *(undefined8 *)(lVar10 + uVar13 * 8);
            iVar14 = iVar14 * 2 + 1;
            uVar13 = uVar13 + 1;
            puVar15 = puVar15 + 7;
          } while (uVar1 != uVar13);
          *(int *)&paramsToFree[5].hiddenData = iVar14;
          if (uVar12 != 0) {
            uVar13 = 0;
            do {
              piVar6 = *(int **)(lVar4 + uVar13 * 8);
              pdVar8[1] = (double)piVar6;
              if (*piVar6 == 0) {
                *pdVar8 = *(double *)(piVar6 + 10);
              }
              else {
                *(int *)pdVar8 = (int)*(double *)(piVar6 + 10);
              }
              uVar13 = uVar13 + 1;
              pdVar8 = pdVar8 + 2;
            } while (uVar13 < uVar12);
          }
          if ((ulong)uVar2 == 0) {
            TVar11 = TA_SUCCESS;
          }
          else {
            lVar10 = 0;
            iVar14 = 0;
            do {
              *(undefined8 *)((long)pvVar9 + lVar10 * 2 + 8) = *(undefined8 *)(lVar5 + lVar10);
              iVar14 = iVar14 * 2 + 1;
              lVar10 = lVar10 + 8;
            } while ((ulong)uVar2 << 3 != lVar10);
            *(int *)((long)&paramsToFree[5].hiddenData + 4) = iVar14;
            TVar11 = TA_SUCCESS;
          }
          goto LAB_0018e084;
        }
      }
LAB_0018e1a4:
      TA_ParamHolderFree(paramsToFree);
    }
  }
  else {
    TVar11 = TA_INVALID_HANDLE;
  }
  paramsToFree = (TA_ParamHolder *)0x0;
LAB_0018e084:
  *allocatedParams = paramsToFree;
  return TVar11;
}

Assistant:

TA_RetCode TA_ParamHolderAlloc( const TA_FuncHandle *handle,
                                TA_ParamHolder **allocatedParams )
{

   TA_FuncDef *funcDef;
   unsigned int allocSize, i;
   TA_ParamHolderInput    *input;
   TA_ParamHolderOptInput *optInput;
   TA_ParamHolderOutput   *output;

   const TA_FuncInfo *funcInfo;
   TA_ParamHolder *newParams;
   TA_ParamHolderPriv *newParamsPriv;

   const TA_InputParameterInfo    **inputInfo;
   const TA_OptInputParameterInfo **optInputInfo;
   const TA_OutputParameterInfo   **outputInfo;

   /* Validate the parameters. */
   if( !handle || !allocatedParams)
   {
      return TA_BAD_PARAM;
   }

   /* Validate that this is a valid funcHandle. */
   funcDef = (TA_FuncDef *)handle;
   if( funcDef->magicNumber != TA_FUNC_DEF_MAGIC_NB )
   {
      *allocatedParams = NULL;
      return TA_INVALID_HANDLE;
   }

   /* Get the TA_FuncInfo. */
   funcInfo = funcDef->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;

   /* Allocate the TA_ParamHolder. */
   newParams = (TA_ParamHolder *)TA_Malloc( sizeof(TA_ParamHolder) + sizeof(TA_ParamHolderPriv));
   if( !newParams )
   {
      *allocatedParams = NULL;
      return TA_ALLOC_ERR;
   }

   memset( newParams, 0, sizeof(TA_ParamHolder) + sizeof(TA_ParamHolderPriv) );
   newParamsPriv = (TA_ParamHolderPriv *)(((char *)newParams)+sizeof(TA_ParamHolder));
   newParamsPriv->magicNumber = TA_PARAM_HOLDER_PRIV_MAGIC_NB;
   newParams->hiddenData = newParamsPriv;

   /* From this point, TA_ParamHolderFree can be safely called. */

   /* Allocate the array of structure holding the info
    * for each parameter.
    */
   if( funcInfo->nbInput == 0 ) return TA_INTERNAL_ERROR(2);

   allocSize = (funcInfo->nbInput) * sizeof(TA_ParamHolderInput);
   input = (TA_ParamHolderInput *)TA_Malloc( allocSize );

   if( !input )
   {
      TA_ParamHolderFree( newParams );
      *allocatedParams = NULL;
      return TA_ALLOC_ERR;
   }
   memset( input, 0, allocSize );
   newParamsPriv->in = input;

   if( funcInfo->nbOptInput == 0 )
      optInput = NULL;
   else
   {
      allocSize = (funcInfo->nbOptInput) * sizeof(TA_ParamHolderOptInput);
      optInput = (TA_ParamHolderOptInput *)TA_Malloc( allocSize );

      if( !optInput )
      {
         TA_ParamHolderFree( newParams );
         *allocatedParams = NULL;
         return TA_ALLOC_ERR;
      }
      memset( optInput, 0, allocSize );
   }
   newParamsPriv->optIn = optInput;

   allocSize = (funcInfo->nbOutput) * sizeof(TA_ParamHolderOutput);
   output = (TA_ParamHolderOutput *)TA_Malloc( allocSize );
   if( !output )
   {
      TA_ParamHolderFree( newParams );
      *allocatedParams = NULL;
      return TA_ALLOC_ERR;
   }
   memset( output, 0, allocSize );
   newParamsPriv->out = output;

   newParamsPriv->funcInfo = funcInfo;

   inputInfo    = (const TA_InputParameterInfo **)funcDef->input;
   optInputInfo = (const TA_OptInputParameterInfo **)funcDef->optInput;
   outputInfo   = (const TA_OutputParameterInfo   **)funcDef->output;

   for( i=0; i < funcInfo->nbInput; i++ )
   {
      input[i].inputInfo = inputInfo[i];
      newParamsPriv->inBitmap <<= 1;
      newParamsPriv->inBitmap |= 1;
   }

   for( i=0; i < funcInfo->nbOptInput; i++ )
   {
      optInput[i].optInputInfo = optInputInfo[i];
      if( optInput[i].optInputInfo->type == TA_OptInput_RealRange )
         optInput[i].data.optInReal = optInputInfo[i]->defaultValue;
      else
         optInput[i].data.optInInteger = (TA_Integer)optInputInfo[i]->defaultValue;
   }

   for( i=0; i < funcInfo->nbOutput; i++ )
   {
      output[i].outputInfo = outputInfo[i];
      newParamsPriv->outBitmap <<= 1;
      newParamsPriv->outBitmap |= 1;
   }

   /* Succcess, return the result to the caller. */
   *allocatedParams = newParams;

   return TA_SUCCESS;
}